

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O2

void draco::parser::ParseLine(DecoderBuffer *buffer,string *out_string)

{
  long lVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  char unaff_R15B;
  
  if (out_string != (string *)0x0) {
    out_string->_M_string_length = 0;
    *(out_string->_M_dataplus)._M_p = '\0';
  }
  iVar4 = 0;
  do {
    lVar1 = buffer->pos_ + 1;
    if (buffer->data_size_ < lVar1) {
      return;
    }
    cVar2 = buffer->data_[buffer->pos_];
    if ((cVar2 == '\r') || (cVar2 == '\n')) {
      cVar3 = cVar2;
      if (iVar4 != 0) {
        if (iVar4 != 1) {
          return;
        }
        if (unaff_R15B == '\n') {
          return;
        }
        cVar3 = unaff_R15B;
        if (cVar2 != '\n') {
          return;
        }
      }
      iVar4 = iVar4 + 1;
      unaff_R15B = cVar3;
LAB_0011110e:
      if ((cVar2 != '\r') && (cVar2 != '\n')) {
        return;
      }
    }
    else if (0 < iVar4) goto LAB_0011110e;
    buffer->pos_ = lVar1;
    if (((out_string != (string *)0x0) && (cVar2 != '\n')) && (cVar2 != '\r')) {
      std::__cxx11::string::push_back((char)out_string);
    }
  } while( true );
}

Assistant:

void ParseLine(DecoderBuffer *buffer, std::string *out_string) {
  if (out_string) {
    out_string->clear();
  }
  char c;
  int num_delims = 0;
  char last_delim;
  while (buffer->Peek(&c)) {
    // Check if |c| is a delimiter symbol. We want to identify all possible
    // delimiters that can occur on different platforms (i.e. we want to detect
    // '\r\n', '\r', '\n').
    const bool is_delim = (c == '\r' || c == '\n');

    if (is_delim) {
      if (num_delims == 0) {
        last_delim = c;
      } else if (num_delims == 1) {
        // We already parsed either '\r' or '\n'. Ensure the new delim symbol is
        // '\n' and different from the previous symbol.
        if (c == last_delim || c != '\n') {
          return;  // Same delimiter symbol already processed.
        }
      } else {
        // Too many delimiter symbols.
        return;
      }
      num_delims++;
    }

    if (!is_delim && num_delims > 0) {
      // We reached a non-delimiter symbol after a delimiter was already found.
      // Stop the parsing.
      return;
    }

    buffer->Advance(1);

    // We put the non-delimiter symbol into the output string.
    if (!is_delim && out_string) {
      out_string->push_back(c);
    }
  }
}